

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O0

void __thiscall
duckdb::Linenoise::EditCapitalizeNextWord(Linenoise *this,Capitalization capitalization)

{
  bool bVar1;
  char in_SIL;
  long in_RDI;
  bool first_char;
  size_t next_pos;
  undefined5 in_stack_ffffffffffffffd0;
  char in_stack_ffffffffffffffd5;
  byte bVar2;
  bool bVar3;
  undefined1 uVar4;
  ulong local_18;
  
  local_18 = *(ulong *)(in_RDI + 0x28);
  while( true ) {
    bVar3 = false;
    if (local_18 < *(ulong *)(in_RDI + 0x38)) {
      bVar3 = IsSpace(*(char *)(*(long *)(in_RDI + 8) + local_18));
    }
    if (bVar3 == false) break;
    local_18 = local_18 + 1;
  }
  bVar3 = true;
  uVar4 = 0;
  while( true ) {
    bVar2 = 0;
    if (local_18 < *(ulong *)(in_RDI + 0x38)) {
      bVar1 = IsSpace(*(char *)(*(long *)(in_RDI + 8) + local_18));
      bVar2 = bVar1 ^ 0xff;
    }
    if ((bVar2 & 1) == 0) break;
    if (in_SIL == '\0') {
      if (((bVar3) && (bVar3 = false, '`' < *(char *)(*(long *)(in_RDI + 8) + local_18))) &&
         (*(char *)(*(long *)(in_RDI + 8) + local_18) < '{')) {
        *(char *)(*(long *)(in_RDI + 8) + local_18) =
             *(char *)(*(long *)(in_RDI + 8) + local_18) + -0x20;
      }
    }
    else if (in_SIL == '\x01') {
      if (('@' < *(char *)(*(long *)(in_RDI + 8) + local_18)) &&
         (*(char *)(*(long *)(in_RDI + 8) + local_18) < '[')) {
        *(char *)(*(long *)(in_RDI + 8) + local_18) =
             *(char *)(*(long *)(in_RDI + 8) + local_18) + ' ';
      }
    }
    else if (((in_SIL == '\x02') && ('`' < *(char *)(*(long *)(in_RDI + 8) + local_18))) &&
            (*(char *)(*(long *)(in_RDI + 8) + local_18) < '{')) {
      *(char *)(*(long *)(in_RDI + 8) + local_18) =
           *(char *)(*(long *)(in_RDI + 8) + local_18) + -0x20;
    }
    local_18 = local_18 + 1;
    in_stack_ffffffffffffffd5 = in_SIL;
  }
  *(ulong *)(in_RDI + 0x28) = local_18;
  RefreshLine((Linenoise *)
              CONCAT17(uVar4,CONCAT16(bVar2,CONCAT15(in_stack_ffffffffffffffd5,
                                                     in_stack_ffffffffffffffd0))));
  return;
}

Assistant:

void Linenoise::EditCapitalizeNextWord(Capitalization capitalization) {
	size_t next_pos = pos;

	// find the next word
	while (next_pos < len && IsSpace(buf[next_pos])) {
		next_pos++;
	}
	bool first_char = true;
	while (next_pos < len && !IsSpace(buf[next_pos])) {
		switch (capitalization) {
		case Capitalization::CAPITALIZE: {
			if (first_char) {
				first_char = false;
				if (buf[next_pos] >= 'a' && buf[next_pos] <= 'z') {
					buf[next_pos] -= 'a' - 'A';
				}
			}
			break;
		}
		case Capitalization::LOWERCASE: {
			if (buf[next_pos] >= 'A' && buf[next_pos] <= 'Z') {
				buf[next_pos] += 'a' - 'A';
			}
			break;
		}
		case Capitalization::UPPERCASE: {
			if (buf[next_pos] >= 'a' && buf[next_pos] <= 'z') {
				buf[next_pos] -= 'a' - 'A';
			}
			break;
		}
		default:
			break;
		}
		next_pos++;
	}
	pos = next_pos;
	RefreshLine();
}